

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepointgen.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  QLatin1StringView other;
  QLatin1StringView other_00;
  bool bVar1;
  int iVar2;
  iterator this;
  iterator iVar3;
  size_t in_RCX;
  int __oflag;
  int __oflag_00;
  char *pcVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar5;
  QIODevice *pQVar6;
  char *pcVar7;
  QString *inputFile;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_1c0;
  QIODevice local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<QString> local_178;
  Parser parser;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  if (argc == 1) {
    usage(0);
  }
  else if (3 < argc) {
    QLatin1StringView::QLatin1StringView((QLatin1StringView *)&local_178,argv[1]);
    other_00.m_size = (qsizetype)local_178.ptr;
    other_00.m_data = (char *)local_178.d;
    QString::operator=((QString *)&local_58,other_00);
    QLatin1StringView::QLatin1StringView((QLatin1StringView *)&local_190,argv[2]);
    other.m_size = (qsizetype)local_190.ptr;
    other.m_data = (char *)local_190.d;
    QString::operator=((QString *)&local_98,other);
    for (uVar5 = 3; (uint)argc != uVar5; uVar5 = uVar5 + 1) {
      QLatin1StringView::QLatin1StringView((QLatin1StringView *)&local_1c0,argv[uVar5]);
      QString::QString((QString *)&parser,(QLatin1StringView)local_1c0._0_16_);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&parser);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
    }
    memset(&parser,0xaa,0xc0);
    Parser::Parser(&parser,(QString *)&local_58);
    this = QList<QString>::begin((QList<QString> *)&local_78);
    iVar3 = QList<QString>::end((QList<QString> *)&local_78);
    for (; this.i != iVar3.i; this.i = this.i + 1) {
      bVar1 = QString::startsWith(this.i,(QChar)0x49,CaseSensitive);
      if (bVar1) {
        local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_178.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QString::right((QString *)&local_190,this.i,((this.i)->d).size + -1);
        in_RCX = 0;
        QString::split((QStringList *)&local_178,(QString *)&local_190,(QChar)0x3b,
                       (SplitBehavior)0x0,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
        QList<QString>::append(&parser.m_includeDirs,(QList<QString> *)&local_178);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_178);
      }
      else {
        local_1a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
        local_1a8.d_ptr._M_t.
        super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
        super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
        super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
             (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
             &DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_1a8,this.i);
        iVar2 = QFile::open((QFile *)&local_1a8,(char *)0x11,__oflag);
        if ((char)iVar2 == '\0') {
          QString::toLocal8Bit((QByteArray *)&local_178,this.i);
          pcVar7 = (char *)local_178.ptr;
          if (local_178.ptr == (QString *)0x0) {
            pcVar7 = "";
          }
          QIODevice::errorString((QString *)&local_1c0,&local_1a8);
          QString::toLocal8Bit((QByteArray *)&local_190,(QString *)&local_1c0);
          pcVar4 = (char *)local_190.ptr;
          if (local_190.ptr == (char16_t *)0x0) {
            pcVar4 = "";
          }
          panic("Cannot open \'%s\' for reading: %s\n",pcVar7,pcVar4);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_190);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_178);
        }
        Parser::parse(&parser,&local_1a8,this.i);
        QFile::~QFile((QFile *)&local_1a8);
      }
    }
    if ((parser.m_functions.d.size == 0) && (parser.m_points.d.size == 0)) {
      QString::toLocal8Bit((QByteArray *)&local_178,(QString *)&local_58);
      pcVar7 = (char *)local_178.ptr;
      if (local_178.ptr == (QString *)0x0) {
        pcVar7 = "";
      }
      panic("empty provider %s\n",pcVar7);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_178);
    }
    local_1a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_1a8.d_ptr._M_t.
    super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
    super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
    super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
         &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_1a8,(QString *)&local_98);
    iVar2 = QFile::open((QFile *)&local_1a8,(char *)0xa,__oflag_00);
    __buf = extraout_RDX;
    if ((char)iVar2 == '\0') {
      QString::toLocal8Bit((QByteArray *)&local_178,(QString *)&local_98);
      pcVar7 = (char *)local_178.ptr;
      if (local_178.ptr == (QString *)0x0) {
        pcVar7 = "";
      }
      QIODevice::errorString((QString *)&local_1c0,&local_1a8);
      QString::toLocal8Bit((QByteArray *)&local_190,(QString *)&local_1c0);
      if (local_190.ptr == (char16_t *)0x0) {
        local_190.ptr = L"";
      }
      panic("Cannot open \'%s\' for writing: %s\n",pcVar7,local_190.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_190);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_178);
      __buf = extraout_RDX_00;
    }
    pQVar6 = &local_1a8;
    Parser::write(&parser,(int)&local_1a8,__buf,in_RCX);
    QFileDevice::close((QFileDevice *)&local_1a8,(int)pQVar6);
    QFile::~QFile((QFile *)&local_1a8);
    Parser::~Parser(&parser);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return 0;
    }
    goto LAB_0010531f;
  }
  usage(-1);
LAB_0010531f:
  __stack_chk_fail();
}

Assistant:

int main(int argc, char *argv[])
{
    QString provider;
    QList<QString> inputFiles;
    QString outFile;

    parseArgs(argc, argv, provider, outFile, inputFiles);

    Parser parser(provider);

    for (const QString &inputFile : inputFiles) {
        if (inputFile.startsWith(QLatin1Char('I'))) {
            QStringList includeDirs = inputFile.right(inputFile.length() - 1).split(QLatin1Char(';'));
            parser.addIncludeDirs(includeDirs);
            continue;
        }
        QFile in(inputFile);
        if (!in.open(QIODevice::ReadOnly | QIODevice::Text)) {
            panic("Cannot open '%s' for reading: %s\n",
                    qPrintable(inputFile), qPrintable(in.errorString()));
        }
        DEBUGPRINTF(printf("tracepointgen: parse %s\n", qPrintable(inputFile)));
        parser.parse(in, inputFile);
    }
    if (parser.isEmpty())
        panic("empty provider %s\n", qPrintable(provider));

    QFile out(outFile);

    if (!out.open(QIODevice::WriteOnly | QIODevice::Truncate)) {
        panic("Cannot open '%s' for writing: %s\n",
                qPrintable(outFile), qPrintable(out.errorString()));
    }

    parser.write(out);
    out.close();

    return 0;
}